

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-common.h
# Opt level: O0

int aead_aesgcm_setup_crypto(ptls_aead_context_t *_ctx,int is_enc,void *key,void *iv)

{
  aesgcm_context_t *ctx;
  void *iv_local;
  void *key_local;
  int is_enc_local;
  ptls_aead_context_t *_ctx_local;
  
  _ctx->dispose_crypto = aesgcm_dispose_crypto;
  _ctx->do_get_iv = aesgcm_get_iv;
  _ctx->do_set_iv = aesgcm_set_iv;
  if (is_enc == 0) {
    _ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    _ctx->do_encrypt =
         (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
          *)0x0;
    _ctx->do_encrypt_v =
         (_func_void_st_ptls_aead_context_t_ptr_void_ptr_ptls_iovec_t_ptr_size_t_uint64_t_void_ptr_size_t
          *)0x0;
    _ctx->do_decrypt = aesgcm_decrypt;
  }
  else {
    _ctx->do_encrypt_init = aesgcm_encrypt_init;
    _ctx->do_encrypt_update = aesgcm_encrypt_update;
    _ctx->do_encrypt_final = aesgcm_encrypt_final;
    _ctx->do_encrypt = ptls_aead__do_encrypt;
    _ctx->do_encrypt_v = ptls_aead__do_encrypt_v;
    _ctx->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
          *)0x0;
  }
  cf_aes_init((cf_aes_context *)(_ctx + 1),(uint8_t *)key,_ctx->algo->key_size);
  _ctx[6].do_encrypt_init = *iv;
  *(undefined4 *)&_ctx[6].do_encrypt_update = *(undefined4 *)((long)iv + 8);
  return 0;
}

Assistant:

static inline int aead_aesgcm_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key, const void *iv)
{
    struct aesgcm_context_t *ctx = (struct aesgcm_context_t *)_ctx;

    ctx->super.dispose_crypto = aesgcm_dispose_crypto;
    ctx->super.do_get_iv = aesgcm_get_iv;
    ctx->super.do_set_iv = aesgcm_set_iv;
    if (is_enc) {
        ctx->super.do_encrypt_init = aesgcm_encrypt_init;
        ctx->super.do_encrypt_update = aesgcm_encrypt_update;
        ctx->super.do_encrypt_final = aesgcm_encrypt_final;
        ctx->super.do_encrypt = ptls_aead__do_encrypt;
        ctx->super.do_encrypt_v = ptls_aead__do_encrypt_v;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_encrypt = NULL;
        ctx->super.do_encrypt_v = NULL;
        ctx->super.do_decrypt = aesgcm_decrypt;
    }

    cf_aes_init(&ctx->aes, key, ctx->super.algo->key_size);
    memcpy(ctx->static_iv, iv, sizeof(ctx->static_iv));
    return 0;
}